

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

void xmlTextReaderValidateEntity(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlNodePtr pxVar2;
  _xmlNode *p_Var3;
  xmlChar *str;
  int iVar4;
  long lVar5;
  xmlNodePtr pxVar6;
  _xmlNode *value;
  
  pxVar2 = reader->node;
  value = pxVar2;
  do {
    xVar1 = value->type;
    if (xVar1 - XML_TEXT_NODE < 2) {
      str = value->content;
      iVar4 = xmlStrlen(str);
      xmlTextReaderValidateCData(reader,str,iVar4);
LAB_001a235c:
      pxVar6 = value->children;
      if (value->children == (xmlNodePtr)0x0) {
        if (value->type == XML_ELEMENT_NODE) {
          xmlTextReaderValidatePop(reader);
        }
LAB_001a2383:
        pxVar6 = value->next;
        if (value->next == (xmlNodePtr)0x0) {
          do {
            value = value->parent;
            if (value->type == XML_ELEMENT_NODE) {
              if (reader->entNr == 0) {
                while ((pxVar6 = value->last, pxVar6 != (xmlNodePtr)0x0 &&
                       ((pxVar6->extra & 2) == 0))) {
                  xmlUnlinkNode(pxVar6);
                  xmlTextReaderFreeNode(reader,pxVar6);
                }
              }
              reader->node = value;
              xmlTextReaderValidatePop(reader);
            }
            if (((value->type == XML_ENTITY_DECL) && (reader->ent != (xmlNodePtr)0x0)) &&
               (reader->ent->children == value)) {
              iVar4 = reader->entNr;
              lVar5 = (long)iVar4;
              if (lVar5 < 1) {
                value = (xmlNodePtr)0x0;
              }
              else {
                reader->entNr = iVar4 + -1;
                if (iVar4 == 1) {
                  pxVar6 = (xmlNodePtr)0x0;
                }
                else {
                  pxVar6 = reader->entTab[lVar5 + -2];
                }
                reader->ent = pxVar6;
                value = reader->entTab[lVar5 + -1];
                reader->entTab[lVar5 + -1] = (xmlNodePtr)0x0;
              }
            }
            pxVar6 = value;
          } while ((((value != pxVar2) && (pxVar6 = value->next, value->next == (xmlNodePtr)0x0)) &&
                   (pxVar6 = value, value != (xmlNodePtr)0x0)) && (value != pxVar2));
        }
      }
    }
    else {
      if (xVar1 == XML_ELEMENT_NODE) {
        reader->node = value;
        xmlTextReaderValidatePush(reader);
        goto LAB_001a235c;
      }
      if (xVar1 != XML_ENTITY_REF_NODE) goto LAB_001a235c;
      p_Var3 = value->children;
      if (((p_Var3 == (_xmlNode *)0x0) || (p_Var3->type != XML_ENTITY_DECL)) ||
         (p_Var3->children == (_xmlNode *)0x0)) {
        if (value != pxVar2) goto LAB_001a2383;
LAB_001a2472:
        reader->node = pxVar2;
        return;
      }
      xmlTextReaderEntPush(reader,value);
      pxVar6 = value->children->children;
    }
    if ((pxVar6 == (xmlNodePtr)0x0) || (value = pxVar6, pxVar6 == pxVar2)) goto LAB_001a2472;
  } while( true );
}

Assistant:

static void
xmlTextReaderValidateEntity(xmlTextReaderPtr reader) {
    xmlNodePtr oldnode = reader->node;
    xmlNodePtr node = reader->node;

    do {
	if (node->type == XML_ENTITY_REF_NODE) {
	    if ((node->children != NULL) &&
		(node->children->type == XML_ENTITY_DECL) &&
		(node->children->children != NULL)) {
		xmlTextReaderEntPush(reader, node);
		node = node->children->children;
		continue;
	    } else {
		/*
		 * The error has probably been raised already.
		 */
		if (node == oldnode)
		    break;
                goto skip_children;
	    }
#ifdef LIBXML_REGEXP_ENABLED
	} else if (node->type == XML_ELEMENT_NODE) {
	    reader->node = node;
	    xmlTextReaderValidatePush(reader);
	} else if ((node->type == XML_TEXT_NODE) ||
		   (node->type == XML_CDATA_SECTION_NODE)) {
            xmlTextReaderValidateCData(reader, node->content,
	                               xmlStrlen(node->content));
#endif
	}

	/*
	 * go to next node
	 */
	if (node->children != NULL) {
	    node = node->children;
	    continue;
	} else if (node->type == XML_ELEMENT_NODE) {
	    xmlTextReaderValidatePop(reader);
	}
skip_children:
	if (node->next != NULL) {
	    node = node->next;
	    continue;
	}
	do {
	    node = node->parent;
	    if (node->type == XML_ELEMENT_NODE) {
	        xmlNodePtr tmp;
		if (reader->entNr == 0) {
		    while ((tmp = node->last) != NULL) {
			if ((tmp->extra & NODE_IS_PRESERVED) == 0) {
			    xmlUnlinkNode(tmp);
			    xmlTextReaderFreeNode(reader, tmp);
			} else
			    break;
		    }
		}
		reader->node = node;
		xmlTextReaderValidatePop(reader);
	    }
	    if ((node->type == XML_ENTITY_DECL) &&
		(reader->ent != NULL) && (reader->ent->children == node)) {
		node = xmlTextReaderEntPop(reader);
	    }
	    if (node == oldnode)
		break;
	    if (node->next != NULL) {
		node = node->next;
		break;
	    }
	} while ((node != NULL) && (node != oldnode));
    } while ((node != NULL) && (node != oldnode));
    reader->node = oldnode;
}